

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O0

void __thiscall
OPNMIDIplay::realTime_Controller(OPNMIDIplay *this,uint8_t channel,uint8_t type,uint8_t value)

{
  uint8_t uVar1;
  ushort uVar2;
  bool bVar3;
  size_type sVar4;
  reference pMVar5;
  byte local_11;
  uint8_t value_local;
  uint8_t type_local;
  uint8_t channel_local;
  OPNMIDIplay *this_local;
  
  sVar4 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::size
                    (&this->m_midiChannels);
  local_11 = channel;
  if (sVar4 < channel) {
    local_11 = channel % 0x10;
  }
  switch(type) {
  case '\0':
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->bank_msb = value;
    if ((this->m_synthMode & 1) == 0) {
      pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
               operator[](&this->m_midiChannels,(ulong)local_11);
      uVar1 = pMVar5->bank_msb;
      pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
               operator[](&this->m_midiChannels,(ulong)local_11);
      bVar3 = isXgPercChannel(uVar1,pMVar5->bank_lsb);
      pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
               operator[](&this->m_midiChannels,(ulong)local_11);
      pMVar5->is_xg_percussion = bVar3;
    }
    break;
  case '\x01':
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->vibrato = value;
    break;
  default:
    break;
  case '\x05':
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    uVar2 = pMVar5->portamento;
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->portamento = uVar2 & 0x7f | (ushort)value << 7;
    updatePortamento(this,(ulong)local_11);
    break;
  case '\x06':
    setRPN(this,(ulong)local_11,(uint)value,true);
    break;
  case '\a':
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->volume = value;
    noteUpdateAll(this,(ulong)local_11,4);
    break;
  case '\n':
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->panning = value;
    noteUpdateAll(this,(ulong)local_11,2);
    break;
  case '\v':
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->expression = value;
    noteUpdateAll(this,(ulong)local_11,4);
    break;
  case ' ':
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->bank_lsb = value;
    if ((this->m_synthMode & 1) == 0) {
      pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
               operator[](&this->m_midiChannels,(ulong)local_11);
      uVar1 = pMVar5->bank_msb;
      pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
               operator[](&this->m_midiChannels,(ulong)local_11);
      bVar3 = isXgPercChannel(uVar1,pMVar5->bank_lsb);
      pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
               operator[](&this->m_midiChannels,(ulong)local_11);
      pMVar5->is_xg_percussion = bVar3;
    }
    break;
  case '%':
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    uVar2 = pMVar5->portamento;
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->portamento = uVar2 & 0x3f80 | (ushort)value;
    updatePortamento(this,(ulong)local_11);
    break;
  case '&':
    setRPN(this,(ulong)local_11,(uint)value,false);
    break;
  case '@':
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->sustain = 0x3f < value;
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    if ((pMVar5->sustain & 1U) == 0) {
      killSustainingNotes(this,(uint)local_11,-1,1);
    }
    break;
  case 'A':
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->portamentoEnable = 0x3f < value;
    updatePortamento(this,(ulong)local_11);
    break;
  case 'B':
    if (value < 0x40) {
      killSustainingNotes(this,(uint)local_11,-1,2);
    }
    else {
      markSostenutoNotes(this,(uint)local_11);
    }
    break;
  case 'C':
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->softPedal = 0x3f < value;
    break;
  case 'J':
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->brightness = value;
    noteUpdateAll(this,(ulong)local_11,4);
    break;
  case '[':
    break;
  case '\\':
    break;
  case ']':
    break;
  case '^':
    break;
  case '_':
    break;
  case 'b':
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->lastlrpn = value;
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->nrpn = true;
    break;
  case 'c':
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->lastmrpn = value;
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->nrpn = true;
    break;
  case 'd':
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->lastlrpn = value;
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->nrpn = false;
    break;
  case 'e':
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->lastmrpn = value;
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    pMVar5->nrpn = false;
    break;
  case 'q':
    break;
  case 'x':
    noteUpdateAll(this,(ulong)local_11,0x60);
    break;
  case 'y':
    pMVar5 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
             operator[](&this->m_midiChannels,(ulong)local_11);
    MIDIchannel::resetAllControllers121(pMVar5);
    noteUpdateAll(this,(ulong)local_11,0xe);
    killSustainingNotes(this,(uint)local_11,-1,3);
    break;
  case '{':
    noteUpdateAll(this,(ulong)local_11,0x20);
  }
  return;
}

Assistant:

void OPNMIDIplay::realTime_Controller(uint8_t channel, uint8_t type, uint8_t value)
{
    if(static_cast<size_t>(channel) > m_midiChannels.size())
        channel = channel % 16;
    switch(type)
    {
    case 1: // Adjust vibrato
        //UI.PrintLn("%u:vibrato %d", MidCh,value);
        m_midiChannels[channel].vibrato = value;
        break;

    case 0: // Set bank msb (GM bank)
        m_midiChannels[channel].bank_msb = value;
        if((m_synthMode & Mode_GS) == 0)// Don't use XG drums on GS synth mode
            m_midiChannels[channel].is_xg_percussion = isXgPercChannel(m_midiChannels[channel].bank_msb, m_midiChannels[channel].bank_lsb);
        break;

    case 32: // Set bank lsb (XG bank)
        m_midiChannels[channel].bank_lsb = value;
        if((m_synthMode & Mode_GS) == 0)// Don't use XG drums on GS synth mode
            m_midiChannels[channel].is_xg_percussion = isXgPercChannel(m_midiChannels[channel].bank_msb, m_midiChannels[channel].bank_lsb);
        break;

    case 5: // Set portamento msb
        m_midiChannels[channel].portamento = static_cast<uint16_t>((m_midiChannels[channel].portamento & 0x007F) | (value << 7));
        updatePortamento(channel);
        break;

    case 37: // Set portamento lsb
        m_midiChannels[channel].portamento = static_cast<uint16_t>((m_midiChannels[channel].portamento & 0x3F80) | (value));
        updatePortamento(channel);
        break;

    case 65: // Enable/disable portamento
        m_midiChannels[channel].portamentoEnable = value >= 64;
        updatePortamento(channel);
        break;

    case 7: // Change volume
        m_midiChannels[channel].volume = value;
        noteUpdateAll(channel, Upd_Volume);
        break;

    case 74: // Change brightness
        m_midiChannels[channel].brightness = value;
        noteUpdateAll(channel, Upd_Volume);
        break;

    case 64: // Enable/disable sustain
        m_midiChannels[channel].sustain = (value >= 64);
        if(!m_midiChannels[channel].sustain)
            killSustainingNotes(channel, -1, OpnChannel::LocationData::Sustain_Pedal);
        break;

    case 66: // Enable/disable sostenuto
        if(value >= 64) //Find notes and mark them as sostenutoed
            markSostenutoNotes(channel);
        else
            killSustainingNotes(channel, -1, OpnChannel::LocationData::Sustain_Sostenuto);
        break;

    case 67: // Enable/disable soft-pedal
        m_midiChannels[channel].softPedal = (value >= 64);
        break;

    case 11: // Change expression (another volume factor)
        m_midiChannels[channel].expression = value;
        noteUpdateAll(channel, Upd_Volume);
        break;

    case 10: // Change panning
        m_midiChannels[channel].panning = value;
        noteUpdateAll(channel, Upd_Pan);
        break;

    case 121: // Reset all controllers
        m_midiChannels[channel].resetAllControllers121();
        noteUpdateAll(channel, Upd_Pan + Upd_Volume + Upd_Pitch);
        // Kill all sustained notes
        killSustainingNotes(channel, -1, OpnChannel::LocationData::Sustain_ANY);
        break;

    case 120: // All sounds off
        noteUpdateAll(channel, Upd_OffMute);
        break;

    case 123: // All notes off
        noteUpdateAll(channel, Upd_Off);
        break;

    case 91:
        break; // Reverb effect depth. We don't do per-channel reverb.

    case 92:
        break; // Tremolo effect depth. We don't do...

    case 93:
        break; // Chorus effect depth. We don't do.

    case 94:
        break; // Celeste effect depth. We don't do.

    case 95:
        break; // Phaser effect depth. We don't do.

    case 98:
        m_midiChannels[channel].lastlrpn = value;
        m_midiChannels[channel].nrpn = true;
        break;

    case 99:
        m_midiChannels[channel].lastmrpn = value;
        m_midiChannels[channel].nrpn = true;
        break;

    case 100:
        m_midiChannels[channel].lastlrpn = value;
        m_midiChannels[channel].nrpn = false;
        break;

    case 101:
        m_midiChannels[channel].lastmrpn = value;
        m_midiChannels[channel].nrpn = false;
        break;

    case 113:
        break; // Related to pitch-bender, used by missimp.mid in Duke3D

    case  6:
        setRPN(channel, value, true);
        break;

    case 38:
        setRPN(channel, value, false);
        break;

    //case 103:
    //    cmf_percussion_mode = (value != 0);
    //    break; // CMF (ctrl 0x67) rhythm mode

    default:
        break;
        //UI.PrintLn("Ctrl %d <- %d (ch %u)", ctrlno, value, MidCh);
    }
}